

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::Assemble
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
           *this,TPZMatrix<double> *matref,TPZFMatrix<double> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long lVar1;
  _func_int *p_Var2;
  int iVar3;
  int iVar4;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this_00;
  ostream *poVar5;
  size_type __n;
  int64_t size;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  ulong uVar7;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *mat;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  TPZVec<int> numelconnected;
  thread local_90;
  TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_> *local_88;
  TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *local_80;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  TPZMatrix<double> **local_60;
  size_type local_58;
  TPZVec<int> local_50;
  TPZFront<double> *this_01;
  
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
              ).field_0xd8,guiInterface);
  this_00 = (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *)
            __dynamic_cast(matref,&TPZMatrix<double>::typeinfo,
                           &TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontSym<double>>
                            ::typeinfo,0);
  local_80 = this_00;
  if (this_00 == (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *)0x0)
  {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "virtual void TPZParFrontStructMatrix<TPZFrontSym<double>, double, TPZStructMatrixTBBFlow<STATE>>::Assemble(TPZMatrix<TVar> &, TPZFMatrix<TVar> &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontSym<double>, TVar = double, TPar = TPZStructMatrixTBBFlow<STATE>]"
                            );
    poVar5 = std::operator<<(poVar5," we are in serious trouble : wrong type of matrix");
    std::endl<char,std::char_traits<char>>(poVar5);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZParFrontStructMatrix.cpp"
               ,0x183);
  }
  lVar1 = *(long *)(*(long *)&(this->
                              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                              ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60);
  if (*(int *)((long)&(this->
                      super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                      ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar1) < 3) {
    *(undefined4 *)
     ((long)&(this->
             super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
             ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh + lVar1) = 3;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Number of Threads ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,*(int *)((long)&(this->
                                             super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                                             ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.
                                             fMesh +
                                     *(long *)(*(long *)&(this->
                                                  super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                                                  ).super_TPZStructMatrixT<double>.
                                                  super_TPZStructMatrix + -0x60)));
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar3 = *(int *)((long)&(this->
                          super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                          ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
                  *(long *)(*(long *)&(this->
                                      super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                                      ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60
                           ));
  __n = (size_type)iVar3;
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_78,__n,(allocator_type *)&local_50);
  size = TPZCompMesh::NEquations
                   ((this->
                    super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                    ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh);
  local_90._M_id._M_thread._0_4_ = 0;
  TPZVec<int>::TPZVec(&local_50,size,(int *)&local_90);
  this->fNElements =
       (((this->
         super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>).
         super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh)->fElementVec).
       super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::OrderElement
            (&this->
              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
            );
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::
  GetNumElConnected(&this->
                     super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
                    ,&local_50);
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::SetNumElConnected
            ((TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *)this_00,
             &local_50);
  p_Var2 = (this_00->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>).
           super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
           super_TPZSavable._vptr_TPZSavable[0x4f];
  if (num_threads.super_argT<int>.super_arg_base.arg_set == true) {
    iVar3 = (*p_Var2)(this_00);
    this_01 = (TPZFront<double> *)CONCAT44(extraout_var,iVar3);
    iVar3 = num_threads.super_argT<int>.value;
  }
  else {
    iVar4 = (*p_Var2)(this_00);
    this_01 = (TPZFront<double> *)CONCAT44(extraout_var_00,iVar4);
    iVar3 = iVar3 + -2;
  }
  TPZFront<double>::ProductTensorMTInitData(this_01,iVar3);
  this->fStiffness = (TPZMatrix<double> *)this_00;
  this->fRhs = rhs;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>)
    .field_0xe0 = 0;
  this->fCurrentAssembled = 0;
  local_88 = this;
  std::thread::
  thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixTBBFlow<double>>*,void>
            (&local_90,GlobalAssemble,&local_88);
  std::thread::operator=
            (local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start + (__n - 1),&local_90);
  std::thread::~thread(&local_90);
  std::thread::
  thread<void*(&)(void*),TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontSym<double>>*&,void>
            (&local_90,
             TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::WriteFile,
             &local_80);
  local_60 = &this->fStiffness;
  local_58 = __n;
  std::thread::operator=
            (local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start + (__n - 2),&local_90);
  std::thread::~thread(&local_90);
  uVar6 = 0;
  uVar7 = __n - 2 & 0xffffffff;
  if ((int)(__n - 2) < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 * 8 != uVar6; uVar6 = uVar6 + 8) {
    local_88 = this;
    std::thread::
    thread<void*(&)(void*),TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixTBBFlow<double>>*,void>
              (&local_90,ElementAssemble,&local_88);
    std::thread::operator=
              ((thread *)
               ((long)&((local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + uVar6),
               &local_90);
    std::thread::~thread(&local_90);
  }
  uVar6 = 0;
  uVar7 = local_58 & 0xffffffff;
  if ((int)local_58 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 * 8 != uVar6; uVar6 = uVar6 + 8) {
    std::thread::join();
  }
  iVar3 = (*(local_80->super_TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>
            ).super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x4f])();
  TPZFront<double>::ProductTensorMTFinish((TPZFront<double> *)CONCAT44(extraout_var_01,iVar3));
  *local_60 = (TPZMatrix<double> *)0x0;
  local_60[1] = (TPZMatrix<double> *)0x0;
  TPZVec<int>::~TPZVec(&local_50);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
  return;
}

Assistant:

void TPZParFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZMatrix<TVar> & matref, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
	this->fGuiInterface = guiInterface;
	
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *>(&matref);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (&matref);
    
#endif
	if(!mat)
	{
		std::cout << __PRETTY_FUNCTION__ << " we are in serious trouble : wrong type of matrix"<< std::endl;
		DebugStop();
	}
	
	int nthreads;
	//cout << "Number of Threads " << endl;
	//cin >> nthreads;
	//fNThreads = nthreads;
    if (this->fNumThreads < 3) {
        this->fNumThreads = 3;
    }
	std::cout << "Number of Threads " << this->fNumThreads << std::endl;
	nthreads = this->fNumThreads;
	std::cout.flush();
	//int nthreads = fNThreads+1;
	
    std::vector<std::thread> allthreads(nthreads);
	int i;
	
	TPZVec <int> numelconnected(this->fMesh->NEquations(),0);
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	
	
	
	
	//TPZParFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZParFrontMatrix<TPZStackEqnStorage, TFront>(this->fMesh->NEquations());
	fNElements = this->fMesh->NElements();
	
	this->OrderElement();
	
//	this->AdjustSequenceNumbering();
    
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        this->fMesh->Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
	
	this->GetNumElConnected(numelconnected);
	
	mat->SetNumElConnected(numelconnected);
	
    if (num_threads.was_set())
        mat->GetFront().ProductTensorMTInitData(num_threads.get_value());
    else
        mat->GetFront().ProductTensorMTInitData( nthreads - 2 ); // Here it initializes the multthread decomposition (comment to deactivate. Remember to coment the Finish also)
	
	fStiffness = mat;
	fRhs = &rhs;
	fCurrentElement = 0;
	fCurrentAssembled = 0;
    
	/*
	 *Triger 'n' threads passing Assemble as argument
	 */
	// try{
    allthreads[nthreads-1] = std::thread(this->GlobalAssemble,this);
//                                        this->GlobalAssemble, this, __FUNCTION__);
//	if(!res[nthreads-1]){
//#ifdef VC
//		cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1].x << endl;
//#else
//		std::cout << "GlobalAssemble Thread created Successfuly "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1].x << std::endl;
//#else
//		std::cout << "GlobalAssemble Thread Fail "<< allthreads[nthreads-1] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
    allthreads[nthreads-2] = std::thread(mat->WriteFile,mat);
//                                        mat->WriteFile, mat, __FUNCTION__);
//	if(!res[nthreads-2]){
//#ifdef VC
//		cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2].x << endl;
//#else
//		std::cout << "WriteFile Thread created Successfuly "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//	}else{
//#ifdef VC
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2].x << std::endl;
//#else
//		std::cout << "WriteFile Thread Fail "<< allthreads[nthreads-2] << std::endl;
//#endif
//		std::cout.flush();
//		//          DebugStop();
//	}
	
	for(i=0;i<nthreads-2;i++){
        allthreads[i] = std::thread(this->ElementAssemble,this);
//		if(!res[i]){
//#ifdef VC
//			cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i].x << endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 <<  " created Successfuly "<< allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}else{
//			std::cout << "Error " << res[i] << "\t";
//#ifdef VC
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i].x << std::endl;
//#else
//			std::cout << "ElementAssemble Thread "<< i+1 << " Fail " << allthreads[i] << std::endl;
//#endif
//			std::cout.flush();
//		}
	}
	for(i=0;i<nthreads;i++) {
        allthreads[i].join();
	}
	
	mat->GetFront().ProductTensorMTFinish(); // Here it ends the multthread decomposition (comment to deactivate. Remember to coment the initialization also)
	fStiffness = 0;
	fRhs = 0;
    
}